

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

void __thiscall
Saturation::ConsequenceFinder::onNewPropositionalClause(ConsequenceFinder *this,Clause *cl)

{
  Literal *pLVar1;
  bool bVar2;
  Clause *pCVar3;
  ostream *poVar4;
  bool *pbVar5;
  uint uVar6;
  Literal *pLVar7;
  uint uVar8;
  Literal **ppLVar9;
  Literal *pLVar10;
  byte bVar11;
  bool bVar12;
  string local_50;
  
  pCVar3 = Inferences::DuplicateLiteralRemovalISE::simplify(&this->_dlr,cl);
  if (pCVar3 != cl) {
    Kernel::Clause::destroyIfUnnecessary(pCVar3);
    return;
  }
  bVar2 = Kernel::Clause::noSplits(cl);
  if ((bVar2) &&
     (pCVar3 = Inferences::TautologyDeletionISE::simplify(&this->_td,cl), pCVar3 != (Clause *)0x0))
  {
    uVar6 = *(uint *)&cl->field_0x38 & 0xfffff;
    uVar8 = (uint)(uVar6 != 0);
    ppLVar9 = (Literal **)0x0;
    if (uVar6 != 0) {
      ppLVar9 = cl->_literals;
    }
    bVar11 = 1;
    pLVar7 = (Literal *)0x0;
    while (ppLVar9 != (Literal **)0x0) {
      pLVar1 = *ppLVar9;
      if ((*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) +
                              (ulong)(pLVar1->super_Term)._functor * 8) + 0x40) & 0x20) == 0) {
        return;
      }
      bVar2 = pLVar7 == (Literal *)0x0;
      pLVar10 = pLVar7;
      if (bVar2) {
        pLVar10 = pLVar1;
      }
      bVar12 = ((pLVar1->super_Term)._args[0]._content & 4) == 0;
      if (!bVar12) {
        pLVar7 = pLVar10;
      }
      bVar11 = bVar11 & (bVar12 || bVar2);
      ppLVar9 = cl->_literals + (int)uVar8;
      if (uVar6 <= uVar8) {
        ppLVar9 = (Literal **)0x0;
      }
      uVar8 = uVar8 + (uVar8 < uVar6);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Pure cf clause: ");
    Kernel::Clause::toNiceString_abi_cxx11_(&local_50,cl);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_50);
    if ((bool)(bVar11 & pLVar7 != (Literal *)0x0)) {
      uVar6 = (pLVar7->super_Term)._functor;
      pbVar5 = Lib::Array<bool>::operator[](&(this->_redundant).super_Array<bool>,(ulong)uVar6);
      if (*pbVar5 == false) {
        pbVar5 = Lib::Array<bool>::operator[](&(this->_redundant).super_Array<bool>,(ulong)uVar6);
        *pbVar5 = true;
        Lib::Stack<unsigned_int>::push(&this->_redundantsToHandle,uVar6);
        poVar4 = std::operator<<((ostream *)&std::cout,"Consequence found: ");
        poVar4 = std::operator<<(poVar4,*(string **)
                                         (*(long *)(DAT_00a14190 + 0x80) + (long)(int)uVar6 * 8));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onNewPropositionalClause(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  //remove duplicate literals (necessary for tautology deletion)
  Clause* dlrCl=_dlr.simplify(cl);

  bool dlrSimplified=dlrCl!=cl;
  if(dlrSimplified) {
    //the function will be called again with the clause that is already simplified
    //TODO: get some cheaper way of testing for duplicate literals presence
    dlrCl->destroyIfUnnecessary();
    return;
  }


  if(!cl->noSplits() || !_td.simplify(cl)) {
    return;
  }
  Literal* pos=0;
  bool horn=true;
  for (auto l : cl->iterLits()) {
    if(!env.signature->getPredicate(l->functor())->label()) {
      return;
    }
    if(l->isPositive()) {
      if(pos) {
        horn=false;
      }
      else {
        pos=l;
      }
    }
  }

  std::cout << "Pure cf clause: " << cl->toNiceString() <<endl;

  if(!horn || !pos) {
    return;
  }

  unsigned red=pos->functor(); //redundant cf symbol number
  if(_redundant[red]) {
    return;
  }
  _redundant[red]=true;

  //we will remove the redundant clauses later -- now we may be at some unsuitable part
  //of the saturation algorithm loop
  _redundantsToHandle.push(red);

  std::cout << "Consequence found: " << env.signature->predicateName(red) << endl;
}